

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsqlquery.cpp
# Opt level: O1

bool __thiscall QSqlQuery::isNull(QSqlQuery *this,QAnyStringView name)

{
  bool bVar1;
  int field;
  long in_FS_OFFSET;
  QSqlRecord QStack_38;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  (*this->d->sqlResult->_vptr_QSqlResult[0x18])(&QStack_38);
  field = QSqlRecord::indexOf(&QStack_38,name);
  QSqlRecord::~QSqlRecord(&QStack_38);
  if (field < 0) {
    lcSqlQuery();
    bVar1 = true;
    if (((byte)lcSqlQuery::category.field_2.bools.enabledWarning._q_value._M_base._M_i & 1) != 0) {
      isNull();
    }
  }
  else {
    bVar1 = isNull(this,field);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return bVar1;
  }
  __stack_chk_fail();
}

Assistant:

bool QSqlQuery::isNull(QAnyStringView name) const
{
    qsizetype index = d->sqlResult->record().indexOf(name);
    if (index > -1)
        return isNull(index);
    qCWarning(lcSqlQuery, "QSqlQuery::isNull: unknown field name '%ls'", qUtf16Printable(name.toString()));
    return true;
}